

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O2

Expression * __thiscall
Kandinsky::BaseExpression::differentiate
          (Expression *__return_storage_ptr__,BaseExpression *this,Variable *variable)

{
  shared_ptr<Kandinsky::BaseExpression> sStack_38;
  __shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &(variable->m_variableExpressionPtr).
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>);
  (*this->_vptr_BaseExpression[1])(&sStack_38,this,&local_28);
  Expression::Expression<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (__return_storage_ptr__,&sStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Expression BaseExpression::differentiate(const Variable& variable) const
    {
        return Expression(derivative(variable.getVariableExpressionPtr()));
    }